

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::Generate
          (ImmutableMessageGenerator *this,Printer *printer)

{
  size_t *psVar1;
  string *psVar2;
  Context *context;
  OneofDescriptor *oneof;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  JavaType type;
  mapped_type *pmVar6;
  Descriptor *pDVar7;
  ImmutableFieldGenerator *pIVar8;
  _Rb_tree_node_base *p_Var9;
  Descriptor *descriptor;
  ulong uVar10;
  ulong extraout_RDX;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field;
  AlphaNum *a_02;
  FieldDescriptor *extraout_RDX_02;
  int j;
  int iVar11;
  string *this_00;
  long lVar12;
  size_t *psVar13;
  int i_1;
  key_type *__k;
  java *this_01;
  int i;
  long lVar14;
  SubstituteArg local_328;
  SubstituteArg local_2f8;
  SubstituteArg local_2c8;
  SubstituteArg local_298;
  undefined8 local_268;
  undefined4 local_260;
  SubstituteArg local_238;
  string local_208 [32];
  pointer local_1e8;
  undefined1 local_1e0 [24];
  undefined1 local_1c8 [8];
  string builder_type;
  undefined1 local_160 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  string local_100;
  undefined1 local_e0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  ImmutableMessageGenerator messageGenerator;
  
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&variables;
  variables._M_t._M_impl._0_4_ = 0;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::string
            ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"static",
             (allocator *)local_e0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_160,
                        (key_type *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::string
            ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"classname",
             (allocator *)local_e0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_160,
                        (key_type *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::_M_assign((string *)pmVar6);
  std::__cxx11::string::~string((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (java *)(this->super_MessageGenerator).descriptor_,descriptor);
  std::__cxx11::string::string
            ((string *)local_e0,"extra_interfaces",
             (allocator *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_160,(key_type *)local_e0);
  psVar1 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar1);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)psVar1);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  std::__cxx11::string::string
            ((string *)local_e0,"ver",
             (allocator *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_160,(key_type *)local_e0);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar1);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)psVar1);
  std::__cxx11::string::string
            ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"deprecation",
             (allocator *)local_e0);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_160,
                        (key_type *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::assign((char *)pmVar6);
  std::__cxx11::string::~string((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  WriteMessageDocComment(printer,(this->super_MessageGenerator).descriptor_);
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::__cxx11::string::string
            ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,"",
             (allocator *)local_e0);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar7,true,
             (string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_1c8 = (undefined1  [8])&builder_type._M_string_length;
  builder_type._M_dataplus._M_p = (pointer)0x0;
  builder_type._M_string_length._0_1_ = 0;
  if (*(int *)((this->super_MessageGenerator).descriptor_ + 0x7c) < 1) {
    google::protobuf::io::Printer::Print((map *)printer,local_160);
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname",(this->super_MessageGenerator).descriptor_);
    google::protobuf::io::Printer::Print((map *)printer,local_160);
    GeneratedCodeVersionSuffix_abi_cxx11_();
    local_e0 = (undefined1  [8])0x0;
    vars._M_t._M_impl._0_4_ = 0xffffffff;
    variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    builder_type.field_2._8_8_ = 0;
    local_238.text_ = (char *)0x0;
    local_238.size_ = -1;
    local_328.text_ = (char *)0x0;
    local_328.size_ = -1;
    local_2f8.text_ = (char *)0x0;
    local_2f8.size_ = -1;
    local_2c8.text_ = (char *)0x0;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_100._M_dataplus._M_p;
    local_2c8.size_ = -1;
    local_298.text_ = (char *)0x0;
    local_298.size_ = -1;
    local_268 = 0;
    local_260 = 0xffffffff;
    google::protobuf::strings::Substitute_abi_cxx11_
              ((char *)local_208,
               (SubstituteArg *)"com.google.protobuf.GeneratedMessage$0.Builder<?>",
               (SubstituteArg *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (SubstituteArg *)local_e0,
               (SubstituteArg *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (SubstituteArg *)((long)&builder_type.field_2 + 8),&local_238,&local_328,&local_2f8,
               &local_2c8,&local_298);
    this_00 = local_208;
    std::__cxx11::string::operator=((string *)local_1c8,this_00);
  }
  else {
    google::protobuf::io::Printer::Print((map *)printer,local_160);
    io::Printer::Annotate<google::protobuf::Descriptor>
              (printer,"classname",(this->super_MessageGenerator).descriptor_);
    google::protobuf::io::Printer::Print((map *)printer,local_160);
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_100,this->name_resolver_,(this->super_MessageGenerator).descriptor_);
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_100._M_dataplus._M_p;
    GeneratedCodeVersionSuffix_abi_cxx11_();
    variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    builder_type.field_2._8_8_ = 0;
    local_238.text_ = (char *)0x0;
    local_238.size_ = -1;
    local_328.text_ = (char *)0x0;
    local_328.size_ = -1;
    local_2f8.text_ = (char *)0x0;
    local_2f8.size_ = -1;
    local_2c8.text_ = (char *)0x0;
    local_e0 = (undefined1  [8])local_1e8;
    local_2c8.size_ = -1;
    local_298.text_ = (char *)0x0;
    local_298.size_ = -1;
    local_268 = 0;
    vars._M_t._M_impl._0_4_ = local_1e0._0_4_;
    local_260 = 0xffffffff;
    google::protobuf::strings::Substitute_abi_cxx11_
              ((char *)local_208,
               (SubstituteArg *)"com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
               (SubstituteArg *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (SubstituteArg *)local_e0,
               (SubstituteArg *)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (SubstituteArg *)((long)&builder_type.field_2 + 8),&local_238,&local_328,&local_2f8,
               &local_2c8,&local_298);
    std::__cxx11::string::operator=((string *)local_1c8,local_208);
    std::__cxx11::string::~string(local_208);
    this_00 = (string *)&local_1e8;
  }
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string((string *)&local_100);
  io::Printer::Print<>(printer,"private static final long serialVersionUID = 0L;\n");
  google::protobuf::io::Printer::Indent();
  io::Printer::Print<char[10],std::__cxx11::string,char[12],std::__cxx11::string>
            (printer,
             "// Use $classname$.newBuilder() to construct.\nprivate $classname$($buildertype$ builder) {\n  super(builder);\n}\n"
             ,(char (*) [10])0x293a02,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->super_MessageGenerator).descriptor_,(char (*) [12])"buildertype",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"private $classname$() {\n",(char (*) [10])0x293a02,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (this->super_MessageGenerator).descriptor_);
  google::protobuf::io::Printer::Indent();
  GenerateInitializers(this,printer);
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>(printer,"}\n\n");
  google::protobuf::io::Printer::Print((map *)printer,local_160);
  io::Printer::Print<>
            (printer,
             "@java.lang.Override\npublic final com.google.protobuf.UnknownFieldSet\ngetUnknownFields() {\n  return this.unknownFields;\n}\n"
            );
  bVar4 = Context::HasGeneratedMethods(this->context_,(this->super_MessageGenerator).descriptor_);
  if (bVar4) {
    GenerateParsingConstructor(this,printer);
  }
  GenerateDescriptorMethods(this,printer);
  lVar14 = 0;
  psVar1 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
  for (lVar12 = 0; pDVar7 = (this->super_MessageGenerator).descriptor_,
      lVar12 < *(int *)(pDVar7 + 0x78); lVar12 = lVar12 + 1) {
    EnumGenerator::EnumGenerator
              ((EnumGenerator *)psVar1,(EnumDescriptor *)(*(long *)(pDVar7 + 0x40) + lVar14),true,
               this->context_);
    EnumGenerator::Generate((EnumGenerator *)psVar1,printer);
    EnumGenerator::~EnumGenerator((EnumGenerator *)psVar1);
    lVar14 = lVar14 + 0x50;
  }
  lVar12 = 0;
  psVar1 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
  for (lVar14 = 0; lVar14 < *(int *)(pDVar7 + 0x74); lVar14 = lVar14 + 1) {
    if (*(char *)(*(long *)(*(long *)(pDVar7 + 0x38) + 0x20 + lVar12) + 0x4b) == '\0') {
      ImmutableMessageGenerator
                ((ImmutableMessageGenerator *)psVar1,
                 (Descriptor *)(*(long *)(pDVar7 + 0x38) + lVar12),this->context_);
      GenerateInterface((ImmutableMessageGenerator *)psVar1,printer);
      Generate((ImmutableMessageGenerator *)psVar1,printer);
      ~ImmutableMessageGenerator((ImmutableMessageGenerator *)psVar1);
      pDVar7 = (this->super_MessageGenerator).descriptor_;
    }
    lVar12 = lVar12 + 0x90;
  }
  lVar12 = 0;
  iVar11 = 0;
  for (lVar14 = 0; lVar14 < *(int *)(pDVar7 + 0x68); lVar14 = lVar14 + 1) {
    pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(pDVar7 + 0x28) + lVar12));
    iVar5 = (*pIVar8->_vptr_ImmutableFieldGenerator[2])(pIVar8);
    iVar11 = iVar11 + iVar5;
    pDVar7 = (this->super_MessageGenerator).descriptor_;
    lVar12 = lVar12 + 0x98;
  }
  iVar5 = (iVar11 + 0x1f) / 0x20;
  uVar10 = (long)(iVar11 + 0x1f) % 0x20 & 0xffffffff;
  this_01 = (java *)0x0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  psVar1 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
  for (; iVar5 != (int)this_01; this_01 = (java *)(ulong)((int)this_01 + 1)) {
    GetBitFieldName_abi_cxx11_((string *)psVar1,this_01,(int)uVar10);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,"private int $bit_field_name$;\n",(char (*) [15])"bit_field_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar1);
    std::__cxx11::string::~string((string *)psVar1);
    uVar10 = extraout_RDX;
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&vars;
  vars._M_t._M_impl._0_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var9 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_left;
  psVar1 = &variables._M_t._M_impl.super__Rb_tree_header._M_node_count;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  while( true ) {
    __k = (key_type *)(builder_type.field_2._M_local_buf + 8);
    psVar13 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if ((_Rb_tree_header *)p_Var9 ==
        &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header) break;
    oneof = *(OneofDescriptor **)(p_Var9 + 1);
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    std::__cxx11::string::string((string *)psVar13,"oneof_name",(allocator *)psVar1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_e0,(key_type *)psVar13);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)psVar13);
    Context::GetOneofGeneratorInfo(this->context_,oneof);
    std::__cxx11::string::string((string *)psVar13,"oneof_capitalized_name",(allocator *)psVar1);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_e0,(key_type *)psVar13);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)psVar13);
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)psVar13,
               (int)(((long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x30)) / 0x30));
    StrCat_abi_cxx11_((string *)psVar1,(protobuf *)psVar13,a);
    std::__cxx11::string::string((string *)__k,"oneof_index",(allocator *)&local_238);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_e0,__k);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)psVar1);
    std::__cxx11::string::~string((string *)__k);
    std::__cxx11::string::~string((string *)psVar1);
    google::protobuf::io::Printer::Print((map *)printer,(char *)local_e0);
    google::protobuf::io::Printer::Print((map *)printer,local_e0);
    google::protobuf::io::Printer::Indent();
    lVar12 = 0;
    while( true ) {
      psVar13 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (*(int *)(oneof + 0x18) <= lVar12) break;
      puVar3 = *(undefined8 **)(*(long *)(oneof + 0x20) + lVar12 * 8);
      local_238.text_ = "";
      if (*(char *)(puVar3[0xf] + 0x4e) != '\0') {
        local_238.text_ = "@java.lang.Deprecated ";
      }
      ToUpper((string *)psVar1,(string *)*puVar3);
      psVar13 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
      strings::AlphaNum::AlphaNum((AlphaNum *)psVar13,*(int *)((long)puVar3 + 0x44));
      psVar2 = (string *)(builder_type.field_2._M_local_buf + 8);
      StrCat_abi_cxx11_(psVar2,(protobuf *)psVar13,a_00);
      io::Printer::
      Print<char[12],char_const*,char[11],std::__cxx11::string,char[13],std::__cxx11::string>
                (printer,"$deprecation$$field_name$($field_number$),\n",(char (*) [12])"deprecation"
                 ,&local_238.text_,(char (*) [11])0x2b33ec,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar1,
                 (char (*) [13])"field_number",psVar2);
      std::__cxx11::string::~string((string *)psVar2);
      std::__cxx11::string::~string((string *)psVar1);
      lVar12 = lVar12 + 1;
    }
    std::__cxx11::string::string
              ((string *)psVar1,"oneof_name",(allocator *)(builder_type.field_2._M_local_buf + 8));
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_e0,(key_type *)psVar1);
    ToUpper((string *)psVar13,pmVar6);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,"$cap_oneof_name$_NOT_SET(0);\n",(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar13);
    std::__cxx11::string::~string((string *)psVar13);
    std::__cxx11::string::~string((string *)psVar1);
    google::protobuf::io::Printer::Print((map *)printer,local_e0);
    google::protobuf::io::Printer::Print((map *)printer,local_e0);
    for (lVar12 = 0; lVar12 < *(int *)(oneof + 0x18); lVar12 = lVar12 + 1) {
      puVar3 = *(undefined8 **)(*(long *)(oneof + 0x20) + lVar12 * 8);
      psVar13 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
      strings::AlphaNum::AlphaNum((AlphaNum *)psVar13,*(int *)((long)puVar3 + 0x44));
      StrCat_abi_cxx11_((string *)psVar1,(protobuf *)psVar13,a_01);
      psVar2 = (string *)(builder_type.field_2._M_local_buf + 8);
      ToUpper(psVar2,(string *)*puVar3);
      io::Printer::Print<char[13],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,"    case $field_number$: return $field_name$;\n",
                 (char (*) [13])"field_number",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar1,
                 (char (*) [11])0x2b33ec,psVar2);
      std::__cxx11::string::~string((string *)psVar2);
      std::__cxx11::string::~string((string *)psVar1);
    }
    std::__cxx11::string::string
              ((string *)psVar1,"oneof_name",(allocator *)(builder_type.field_2._M_local_buf + 8));
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_e0,(key_type *)psVar1);
    psVar13 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
    ToUpper((string *)psVar13,pmVar6);
    io::Printer::Print<char[15],std::__cxx11::string>
              (printer,
               "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
               ,(char (*) [15])"cap_oneof_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar13);
    std::__cxx11::string::~string((string *)psVar13);
    std::__cxx11::string::~string((string *)psVar1);
    google::protobuf::io::Printer::Outdent();
    io::Printer::Print<>(printer,"};\n\n");
    google::protobuf::io::Printer::Print((map *)printer,local_e0);
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
  }
  bVar4 = IsAnyMessage((this->super_MessageGenerator).descriptor_);
  field = extraout_RDX_00;
  if (bVar4) {
    io::Printer::Print<>
              (printer,
               "private static String getTypeUrl(\n    java.lang.String typeUrlPrefix,\n    com.google.protobuf.Descriptors.Descriptor descriptor) {\n  return typeUrlPrefix.endsWith(\"/\")\n      ? typeUrlPrefix + descriptor.getFullName()\n      : typeUrlPrefix + \"/\" + descriptor.getFullName();\n}\n\nprivate static String getTypeNameFromTypeUrl(\n    java.lang.String typeUrl) {\n  int pos = typeUrl.lastIndexOf(\'/\');\n  return pos == -1 ? \"\" : typeUrl.substring(pos + 1);\n}\n\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(\"type.googleapis.com\",\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\n/**\n * Packs a message using the given type URL prefix. The type URL will\n * be constructed by concatenating the message type\'s full name to the\n * prefix with an optional \"/\" separator if the prefix doesn\'t end\n * with \"/\" already.\n */\npublic static <T extends com.google.protobuf.Message> Any pack(\n    T message, java.lang.String typeUrlPrefix) {\n  return Any.newBuilder()\n      .setTypeUrl(getTypeUrl(typeUrlPrefix,\n                             message.getDescriptorForType()))\n      .setValue(message.toByteString())\n      .build();\n}\n\npublic <T extends com.google.protobuf.Message> boolean is(\n    java.lang.Class<T> clazz) {\n  T defaultInstance =\n      com.google.protobuf.Internal.getDefaultInstance(clazz);\n  return getTypeNameFromTypeUrl(getTypeUrl()).equals(\n      defaultInstance.getDescriptorForType().getFullName());\n}\n\nprivate volatile com.google.protobuf.Message cachedUnpackValue;\n\n@java.lang.SuppressWarnings(\"unchecked\")\npublic <T extends com.google.protobuf.Message> T unpack(\n    java.lang.Class<T> clazz)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n  boolean invalidClazz = false;\n  if (cachedUnpackValue != null) {\n    if (cachedUnpackValue.getClass() == clazz) {\n      return (T) cachedUnpackValue;\n    }\n    invalidClazz = true;\n  }\n  if (invalidClazz || !is(clazz)) {\n    t..." /* TRUNCATED STRING LITERAL */
              );
    field = extraout_RDX_01;
  }
  lVar12 = 0;
  psVar1 = &variables._M_t._M_impl.super__Rb_tree_header._M_node_count;
  psVar13 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
  psVar2 = (string *)(builder_type.field_2._M_local_buf + 8);
  for (lVar14 = 0; pDVar7 = (this->super_MessageGenerator).descriptor_,
      lVar14 < *(int *)(pDVar7 + 0x68); lVar14 = lVar14 + 1) {
    FieldConstantName_abi_cxx11_((string *)psVar1,(java *)(*(long *)(pDVar7 + 0x28) + lVar12),field)
    ;
    strings::AlphaNum::AlphaNum
              ((AlphaNum *)psVar13,
               *(int *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + 0x44 + lVar12
                       ));
    StrCat_abi_cxx11_(psVar2,(protobuf *)psVar13,a_02);
    io::Printer::Print<char[14],std::__cxx11::string,char[7],std::__cxx11::string>
              (printer,"public static final int $constant_name$ = $number$;\n",
               (char (*) [14])0x2a145d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar1,
               (char (*) [7])0x2b3515,psVar2);
    std::__cxx11::string::~string((string *)psVar2);
    std::__cxx11::string::~string((string *)psVar1);
    pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (&this->field_generators_,
                        (FieldDescriptor *)
                        (*(long *)((this->super_MessageGenerator).descriptor_ + 0x28) + lVar12));
    (*pIVar8->_vptr_ImmutableFieldGenerator[5])(pIVar8,printer);
    io::Printer::Print<>(printer,"\n");
    lVar12 = lVar12 + 0x98;
    field = extraout_RDX_02;
  }
  bVar4 = Context::HasGeneratedMethods(this->context_,pDVar7);
  if (bVar4) {
    GenerateIsInitialized(this,printer);
    GenerateMessageSerializationMethods(this,printer);
    GenerateEqualsAndHashCode(this,printer);
  }
  GenerateParseFromMethods(this,printer);
  GenerateBuilder(this,printer);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n",
             (char (*) [10])0x2922f7,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              ((this->super_MessageGenerator).descriptor_ + 8));
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"private static final $classname$ DEFAULT_INSTANCE;\n",(char (*) [10])0x293a02,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"static {\n  DEFAULT_INSTANCE = new $classname$();\n}\n\n",
             (char (*) [10])0x293a02,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n",
             (char (*) [10])0x293a02,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  bVar4 = IsWrappersProtoFile(*(FileDescriptor **)
                               ((this->super_MessageGenerator).descriptor_ + 0x10));
  if (bVar4) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,this->name_resolver_
               ,(this->super_MessageGenerator).descriptor_);
    type = GetJavaType(*(FieldDescriptor **)((this->super_MessageGenerator).descriptor_ + 0x28));
    variables._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)PrimitiveTypeName(type);
    io::Printer::Print<char[10],std::__cxx11::string,char[11],char_const*>
              (printer,
               "public static $classname$ of($field_type$ value) {\n  return newBuilder().setValue(value).build();\n}\n\n"
               ,(char (*) [10])0x293a02,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &vars._M_t._M_impl.super__Rb_tree_header._M_node_count,(char (*) [11])0x299f97,
               (char **)&variables._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  GenerateParser(this,printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&vars._M_t._M_impl.super__Rb_tree_header._M_node_count,this->name_resolver_,
             (this->super_MessageGenerator).descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "@java.lang.Override\npublic $classname$ getDefaultInstanceForType() {\n  return DEFAULT_INSTANCE;\n}\n\n"
             ,(char (*) [10])0x293a02,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  psVar1 = &vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::~string((string *)psVar1);
  lVar12 = 0;
  for (lVar14 = 0; pDVar7 = (this->super_MessageGenerator).descriptor_,
      lVar14 < *(int *)(pDVar7 + 0x80); lVar14 = lVar14 + 1) {
    ImmutableExtensionGenerator::ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)psVar1,
               (FieldDescriptor *)(*(long *)(pDVar7 + 0x50) + lVar12),this->context_);
    ImmutableExtensionGenerator::Generate((ImmutableExtensionGenerator *)psVar1,printer);
    ImmutableExtensionGenerator::~ImmutableExtensionGenerator((ImmutableExtensionGenerator *)psVar1)
    ;
    lVar12 = lVar12 + 0x98;
  }
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>(printer,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_e0);
  std::__cxx11::string::~string((string *)local_1c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_160);
  return;
}

Assistant:

void ImmutableMessageGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<std::string, std::string> variables;
  variables["static"] = is_own_file ? "" : "static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["ver"] = GeneratedCodeVersionSuffix();
  variables["deprecation"] =
      descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);

  // The builder_type stores the super type name of the nested Builder class.
  std::string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(
        variables,
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableMessage<\n"
        "      $classname$> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessage$1.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_),
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        variables,
        "$deprecation$public $static$final class $classname$ extends\n");
    printer->Annotate("classname", descriptor_);
    printer->Print(variables,
                   "    com.google.protobuf.GeneratedMessage$ver$ implements\n"
                   "    $extra_interfaces$\n"
                   "    $classname$OrBuilder {\n");
    builder_type =
        strings::Substitute("com.google.protobuf.GeneratedMessage$0.Builder<?>",
                         GeneratedCodeVersionSuffix());
  }
  printer->Print("private static final long serialVersionUID = 0L;\n");

  printer->Indent();
  // Using builder_type, instead of Builder, prevents the Builder class from
  // being loaded into PermGen space when the default instance is created.
  // This optimizes the PermGen space usage for clients that do not modify
  // messages.
  printer->Print(
      "// Use $classname$.newBuilder() to construct.\n"
      "private $classname$($buildertype$ builder) {\n"
      "  super(builder);\n"
      "}\n",
      "classname", descriptor_->name(), "buildertype", builder_type);
  printer->Print("private $classname$() {\n", "classname", descriptor_->name());
  printer->Indent();
  GenerateInitializers(printer);
  printer->Outdent();
  printer->Print(
      "}\n"
      "\n");

  printer->Print(variables,
                 "@java.lang.Override\n"
                 "@SuppressWarnings({\"unused\"})\n"
                 "protected java.lang.Object newInstance(\n"
                 "    UnusedPrivateParameter unused) {\n"
                 "  return new $classname$();\n"
                 "}\n"
                 "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public final com.google.protobuf.UnknownFieldSet\n"
      "getUnknownFields() {\n"
      "  return this.unknownFields;\n"
      "}\n");

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateParsingConstructor(printer);
  }

  GenerateDescriptorMethods(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumGenerator(descriptor_->enum_type(i), true, context_).Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageGenerator messageGenerator(descriptor_->nested_type(i),
                                               context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (auto oneof : oneofs_) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat((oneof)->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(
        vars,
        "public enum $oneof_capitalized_name$Case\n"
        // TODO(dweis): Remove EnumLite when we want to break compatibility with
        // 3.x users
        "    implements com.google.protobuf.Internal.EnumLite,\n"
        "        com.google.protobuf.AbstractMessage.InternalOneOfEnum {\n");
    printer->Indent();
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print(
          "$deprecation$$field_name$($field_number$),\n", "deprecation",
          field->options().deprecated() ? "@java.lang.Deprecated " : "",
          "field_name", ToUpper(field->name()), "field_number",
          StrCat(field->number()));
    }
    printer->Print("$cap_oneof_name$_NOT_SET(0);\n", "cap_oneof_name",
                   ToUpper(vars["oneof_name"]));
    printer->Print(vars,
                   "private final int value;\n"
                   "private $oneof_capitalized_name$Case(int value) {\n"
                   "  this.value = value;\n"
                   "}\n");
    printer->Print(
        vars,
        "/**\n"
        " * @param value The number of the enum to look for.\n"
        " * @return The enum associated with the given number.\n"
        " * @deprecated Use {@link #forNumber(int)} instead.\n"
        " */\n"
        "@java.lang.Deprecated\n"
        "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
        "  return forNumber(value);\n"
        "}\n"
        "\n"
        "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
        "  switch (value) {\n");
    for (int j = 0; j < (oneof)->field_count(); j++) {
      const FieldDescriptor* field = (oneof)->field(j);
      printer->Print("    case $field_number$: return $field_name$;\n",
                     "field_number", StrCat(field->number()),
                     "field_name", ToUpper(field->name()));
    }
    printer->Print(
        "    case 0: return $cap_oneof_name$_NOT_SET;\n"
        "    default: return null;\n"
        "  }\n"
        "}\n"
        "public int getNumber() {\n"
        "  return this.value;\n"
        "}\n",
        "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n");
  }

  if (IsAnyMessage(descriptor_)) {
    GenerateAnyMethods(printer);
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
                   "constant_name", FieldConstantName(descriptor_->field(i)),
                   "number", StrCat(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateMessageSerializationMethods(printer);
    GenerateEqualsAndHashCode(printer);
  }


  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(class_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print("private static final $classname$ DEFAULT_INSTANCE;\n",
                 "classname",
                 name_resolver_->GetImmutableClassName(descriptor_));
  printer->Print(
      "static {\n"
      "  DEFAULT_INSTANCE = new $classname$();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // 'of' method for Wrappers
  if (IsWrappersProtoFile(descriptor_->file())) {
    printer->Print(
        "public static $classname$ of($field_type$ value) {\n"
        "  return newBuilder().setValue(value).build();\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "field_type", PrimitiveTypeName(GetJavaType(descriptor_->field(0))));
  }

  GenerateParser(printer);

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}